

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffrtnm(char *url,char *rootname,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  size_t sVar4;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char infile [1025];
  char urltype [20];
  char *ptr4;
  char *ptr3;
  char *ptr2;
  char *ptr1;
  int infilelen;
  int slen;
  int jj;
  int ii;
  char local_478 [1040];
  char local_68 [24];
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  char *local_18;
  int local_4;
  
  if (0 < *in_RDX) {
    return *in_RDX;
  }
  *in_RSI = '\0';
  local_68[0] = '\0';
  local_478[0] = '\0';
  local_38 = in_RDI;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (*in_RDI == '-') {
    strcat(local_68,"-");
    local_38 = local_38 + 1;
  }
  else {
    iVar1 = strncmp(in_RDI,"stdin",5);
    if ((iVar1 == 0) || (iVar1 = strncmp(local_38,"STDIN",5), iVar1 == 0)) {
      strcat(local_68,"-");
      local_38 = local_38 + 5;
    }
    else {
      local_40 = strstr(local_38,"://");
      local_48 = strstr(local_38,"(");
      if ((local_48 != (char *)0x0) && (local_48 < local_40)) {
        local_40 = (char *)0x0;
      }
      if (local_40 == (char *)0x0) {
        iVar1 = strncmp(local_38,"ftp:",4);
        if (iVar1 == 0) {
          strcat(local_68,"ftp://");
          local_38 = local_38 + 4;
        }
        else {
          iVar1 = strncmp(local_38,"gsiftp:",7);
          if (iVar1 == 0) {
            strcat(local_68,"gsiftp://");
            local_38 = local_38 + 7;
          }
          else {
            iVar1 = strncmp(local_38,"http:",5);
            if (iVar1 == 0) {
              strcat(local_68,"http://");
              local_38 = local_38 + 5;
            }
            else {
              iVar1 = strncmp(local_38,"mem:",4);
              if (iVar1 == 0) {
                strcat(local_68,"mem://");
                local_38 = local_38 + 4;
              }
              else {
                iVar1 = strncmp(local_38,"shmem:",6);
                if (iVar1 == 0) {
                  strcat(local_68,"shmem://");
                  local_38 = local_38 + 6;
                }
                else {
                  iVar1 = strncmp(local_38,"file:",5);
                  if (iVar1 == 0) {
                    local_38 = local_38 + 5;
                  }
                }
              }
            }
          }
        }
      }
      else {
        if (0x13 < (long)(local_40 + (3 - (long)local_38))) {
          *local_20 = 0x7d;
          return 0x7d;
        }
        strncat(local_68,local_38,(size_t)(local_40 + (3 - (long)local_38)));
        local_38 = local_40 + 3;
      }
    }
  }
  local_40 = strchr(local_38,0x28);
  local_48 = strchr(local_38,0x5b);
  if (local_40 != (char *)0x0) {
    for (local_50 = strchr(local_40,0x29); local_50 != (char *)0x0 && local_40 != (char *)0x0;
        local_50 = strchr(local_50,0x29)) {
      do {
        local_50 = local_50 + 1;
      } while (*local_50 == ' ');
      if ((*local_50 == '\0') || (*local_50 == '[')) break;
      local_40 = strchr(local_40 + 1,0x28);
    }
  }
  if (local_40 == local_48) {
    sVar2 = strlen(local_38);
    if (0x400 < sVar2) {
      *local_20 = 0x7d;
      return 0x7d;
    }
    strcat(local_478,local_38);
  }
  else if (local_48 == (char *)0x0) {
    if (0x400 < (long)local_40 - (long)local_38) {
      *local_20 = 0x7d;
      return 0x7d;
    }
    strncat(local_478,local_38,(long)local_40 - (long)local_38);
    local_40 = local_40 + 1;
    local_38 = strchr(local_40,0x29);
    if (local_38 == (char *)0x0) {
      *local_20 = 0x7d;
      return 0x7d;
    }
  }
  else if ((local_40 == (char *)0x0) || (local_48 <= local_40)) {
    if (0x400 < (long)local_48 - (long)local_38) {
      *local_20 = 0x7d;
      return 0x7d;
    }
    strncat(local_478,local_38,(long)local_48 - (long)local_38);
  }
  else {
    if (0x400 < (long)local_40 - (long)local_38) {
      *local_20 = 0x7d;
      return 0x7d;
    }
    strncat(local_478,local_38,(long)local_40 - (long)local_38);
    local_40 = local_40 + 1;
    local_38 = strchr(local_40,0x29);
    if (local_38 == (char *)0x0) {
      *local_20 = 0x7d;
      return 0x7d;
    }
  }
  sVar2 = strlen(local_478);
  local_2c = (int)sVar2;
  for (local_24 = (int)sVar2 + -1; (0 < local_24 && (local_478[local_24] == ' '));
      local_24 = local_24 + -1) {
    local_478[local_24] = '\0';
  }
  sVar2 = strlen(local_478);
  local_28 = (int)sVar2;
  for (local_24 = local_28 + -1; (-1 < local_24 && (local_478[local_24] != '+'));
      local_24 = local_24 + -1) {
  }
  if ((0 < local_24) && (local_28 - local_24 < 5)) {
    local_30 = local_24;
    do {
      local_24 = local_24 + 1;
      if (local_28 <= local_24) break;
      ppuVar3 = __ctype_b_loc();
    } while (((*ppuVar3)[(int)local_478[local_24]] & 0x800) != 0);
    if (local_24 == local_28) {
      local_478[local_30] = '\0';
    }
  }
  sVar2 = strlen(local_68);
  sVar4 = strlen(local_478);
  if (sVar2 + sVar4 < 0x401) {
    strcat(local_18,local_68);
    strcat(local_18,local_478);
    local_4 = *local_20;
  }
  else {
    *local_20 = 0x7d;
    local_4 = 0x7d;
  }
  return local_4;
}

Assistant:

int ffrtnm(char *url, 
           char *rootname,
           int *status)
/*
   parse the input URL, returning the root name (filetype://basename).
*/

{ 
    int ii, jj, slen, infilelen;
    char *ptr1, *ptr2, *ptr3, *ptr4;
    char urltype[MAX_PREFIX_LEN];
    char infile[FLEN_FILENAME];

    if (*status > 0)
        return(*status);

    ptr1 = url;
    *rootname = '\0';
    *urltype = '\0';
    *infile  = '\0';

    /*  get urltype (e.g., file://, ftp://, http://, etc.)  */
    if (*ptr1 == '-')        /* "-" means read file from stdin */
    {
        strcat(urltype, "-");
        ptr1++;
    }
    else if (!strncmp(ptr1, "stdin", 5) || !strncmp(ptr1, "STDIN", 5))
    {
        strcat(urltype, "-");
        ptr1 = ptr1 + 5;
    }
    else
    {
        ptr2 = strstr(ptr1, "://");
        ptr3 = strstr(ptr1, "(" );

        if (ptr3 && (ptr3 < ptr2) )
        {
           /* the urltype follows a '(' character, so it must apply */
           /* to the output file, and is not the urltype of the input file */
           ptr2 = 0;   /* so reset pointer to zero */
        }


        if (ptr2)                  /* copy the explicit urltype string */ 
        {

	   if (ptr2 - ptr1 + 3 > MAX_PREFIX_LEN - 1)
	   {
               return(*status = URL_PARSE_ERROR);
           }
            strncat(urltype, ptr1, ptr2 - ptr1 + 3);
            ptr1 = ptr2 + 3;
        }
        else if (!strncmp(ptr1, "ftp:", 4) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "ftp://");
            ptr1 += 4;
        }
        else if (!strncmp(ptr1, "gsiftp:", 7) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "gsiftp://");
            ptr1 += 7;
        }
        else if (!strncmp(ptr1, "http:", 5) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "http://");
            ptr1 += 5;
        }
        else if (!strncmp(ptr1, "mem:", 4) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "mem://");
            ptr1 += 4;
        }
        else if (!strncmp(ptr1, "shmem:", 6) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "shmem://");
            ptr1 += 6;
        }
        else if (!strncmp(ptr1, "file:", 5) )
        {                              /* the 2 //'s are optional */
            ptr1 += 5;
        }

        /* else assume file driver    */
    }
 
       /*  get the input file name  */
    ptr2 = strchr(ptr1, '(');   /* search for opening parenthesis ( */
    ptr3 = strchr(ptr1, '[');   /* search for opening bracket [ */
    if (ptr2)
    {
       ptr4 = strchr(ptr2, ')');
       while (ptr4 && ptr2)
       {
          do {
             ++ptr4;
          }  while (*ptr4 == ' ');
          if (*ptr4 == 0 || *ptr4 == '[')
             break;
          ptr2 = strchr(ptr2+1, '(');
          ptr4 = strchr(ptr4, ')');
       }
    }

    if (ptr2 == ptr3)  /* simple case: no [ or ( in the file name */
    {

	if (strlen(ptr1) > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR);
        }

        strcat(infile, ptr1);
    }
    else if (!ptr3)     /* no bracket, so () enclose output file name */
    {

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR);
        }

        strncat(infile, ptr1, ptr2 - ptr1);
        ptr2++;

        ptr1 = strchr(ptr2, ')' );   /* search for closing ) */
        if (!ptr1)
            return(*status = URL_PARSE_ERROR);  /* error, no closing ) */

    }
    else if (ptr2 && (ptr2 < ptr3)) /* () enclose output name before bracket */
    {

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(infile, ptr1, ptr2 - ptr1);
        ptr2++;

        ptr1 = strchr(ptr2, ')' );   /* search for closing ) */
        if (!ptr1)
            return(*status = URL_PARSE_ERROR);  /* error, no closing ) */
    }
    else    /*   bracket comes first, so there is no output name */
    {
	if (ptr3 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(infile, ptr1, ptr3 - ptr1);
    }

       /* strip off any trailing blanks in the names */
    slen = strlen(infile);
    for (ii = slen - 1; ii > 0; ii--)   
    {
        if (infile[ii] == ' ')
            infile[ii] = '\0';
        else
            break;
    }

    /* --------------------------------------------- */
    /* check if the 'filename+n' convention has been */
    /* used to specifiy which HDU number to open     */ 
    /* --------------------------------------------- */

    jj = strlen(infile);

    for (ii = jj - 1; ii >= 0; ii--)
    {
        if (infile[ii] == '+')    /* search backwards for '+' sign */
            break;
    }

    if (ii > 0 && (jj - ii) < 5)  /* limit extension numbers to 4 digits */
    {
        infilelen = ii;
        ii++;


        for (; ii < jj; ii++)
        {
            if (!isdigit((int) infile[ii] ) ) /* are all the chars digits? */
                break;
        }

        if (ii == jj)      
        {
             /* yes, the '+n' convention was used.  */

             infile[infilelen] = '\0'; /* delete the extension number */
        }
    }

    if (strlen(urltype) + strlen(infile) > FLEN_FILENAME - 1)
    {
            return(*status = URL_PARSE_ERROR); 
    }

    strcat(rootname, urltype);  /* construct the root name */
    strcat(rootname, infile);

    return(*status);
}